

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall re2::DFA::PossibleMatchRange(DFA *this,string *min,string *max,int maxlen)

{
  string *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  State *pSVar3;
  State *pSVar4;
  StringPiece *extraout_RDX;
  StringPiece *extraout_RDX_00;
  StringPiece *extraout_RDX_01;
  StringPiece *extraout_RDX_02;
  StringPiece *extraout_RDX_03;
  StringPiece *pSVar5;
  int j_1;
  byte bVar6;
  byte bVar7;
  int j;
  int iVar8;
  State *s;
  int local_114;
  string *local_110;
  int local_104;
  Mutex *local_100;
  RWLocker l;
  map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
  previously_visited_states;
  pointer local_b8;
  undefined4 local_b0;
  string local_a8;
  SearchParams local_88;
  
  if (this->init_failed_ == false) {
    previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_header;
    previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    l.mu_ = &this->cache_mutex_;
    l.writing_ = false;
    previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         previously_visited_states._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    Mutex::ReaderLock(l.mu_);
    local_88.text.ptr_ = (char *)0x0;
    local_88.text.length_ = 0;
    local_88.context.ptr_ = (char *)0x0;
    local_88.context.length_ = 0;
    local_88.run_forward = false;
    local_88.start = (State *)0x0;
    local_88.firstbyte = -1;
    local_88.failed = false;
    local_88.ep = (char *)0x0;
    local_88.matches = (vector<int,_std::allocator<int>_> *)0x0;
    local_88.anchored = true;
    local_88.want_earliest_match = false;
    local_88.cache_lock = &l;
    bVar1 = AnalyzeSearch(this,&local_88);
    pSVar4 = local_88.start;
    if ((bVar1) && (local_88.start != (State *)0x2)) {
      if (local_88.start == (State *)0x1) {
        std::__cxx11::string::assign((char *)min);
        bVar1 = true;
        std::__cxx11::string::assign((char *)max);
      }
      else {
        s = local_88.start;
        min->_M_string_length = 0;
        *(min->_M_dataplus)._M_p = '\0';
        local_100 = &this->mutex_;
        local_110 = max;
        Mutex::Lock(local_100);
        local_114 = 0;
        if (maxlen < 1) {
          maxlen = 0;
          local_114 = 0;
        }
        while ((local_114 != maxlen &&
               (pmVar2 = std::
                         map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                         ::operator[](&previously_visited_states,&s), *pmVar2 < 1))) {
          pmVar2 = std::
                   map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                   ::operator[](&previously_visited_states,&s);
          *pmVar2 = *pmVar2 + 1;
          pSVar3 = RunStateOnByte(this,s,0x100);
          if (pSVar3 != (State *)0x1) {
            if (pSVar3 == (State *)0x0) {
LAB_0011fbef:
              bVar1 = false;
              goto LAB_0011fc36;
            }
            if ((pSVar3 == (State *)0x2) || ((pSVar3->flag_ & 0x1000) != 0)) break;
          }
          iVar8 = 0;
          while( true ) {
            if (iVar8 == 0x100) goto LAB_0011fafe;
            pSVar3 = RunStateOnByte(this,s,iVar8);
            if (pSVar3 == (State *)0x0) goto LAB_0011fbef;
            if ((pSVar3 == (State *)0x2) || (((State *)0x2 < pSVar3 && (0 < pSVar3->ninst_))))
            break;
            iVar8 = iVar8 + 1;
          }
          std::__cxx11::string::append((ulong)min,'\x01');
          local_114 = local_114 + 1;
          s = pSVar3;
        }
LAB_0011fafe:
        std::
        _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
        ::clear(&previously_visited_states._M_t);
        s = pSVar4;
        local_110->_M_string_length = 0;
        *(local_110->_M_dataplus)._M_p = '\0';
        iVar8 = 0;
        bVar1 = false;
        pSVar5 = extraout_RDX;
        local_104 = maxlen;
        while( true ) {
          this_00 = local_110;
          local_114 = iVar8;
          if ((iVar8 == local_104) ||
             (pmVar2 = std::
                       map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                       ::operator[](&previously_visited_states,&s), pSVar5 = extraout_RDX_00,
             0 < *pmVar2)) break;
          pmVar2 = std::
                   map<re2::DFA::State_*,_int,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
                   ::operator[](&previously_visited_states,&s);
          *pmVar2 = *pmVar2 + 1;
          iVar8 = 0xff;
          pSVar5 = extraout_RDX_01;
          while( true ) {
            bVar7 = (byte)((uint)iVar8 >> 0x1f);
            bVar6 = 1;
            if (iVar8 < 0) break;
            pSVar4 = RunStateOnByte(this,s,iVar8);
            pSVar5 = extraout_RDX_02;
            if (pSVar4 == (State *)0x0) {
              bVar1 = false;
              break;
            }
            if ((pSVar4 == (State *)0x2) || (((State *)0x2 < pSVar4 && (0 < pSVar4->ninst_)))) {
              std::__cxx11::string::append((ulong)local_110,'\x01');
              bVar7 = 1;
              bVar6 = 0;
              pSVar5 = extraout_RDX_03;
              s = pSVar4;
              break;
            }
            iVar8 = iVar8 + -1;
          }
          bVar1 = (bool)(bVar7 & bVar6 | bVar1);
          if ((bVar7 == 0) || (iVar8 = local_114 + 1, bVar6 != 0)) goto LAB_0011fc36;
        }
        local_b8 = (this_00->_M_dataplus)._M_p;
        local_b0 = (undefined4)this_00->_M_string_length;
        PrefixSuccessor_abi_cxx11_(&local_a8,(re2 *)&local_b8,pSVar5);
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        bVar1 = this_00->_M_string_length != 0;
LAB_0011fc36:
        Mutex::Unlock(local_100);
      }
    }
    else {
      bVar1 = false;
    }
    RWLocker::~RWLocker(&l);
    std::
    _Rb_tree<re2::DFA::State_*,_std::pair<re2::DFA::State_*const,_int>,_std::_Select1st<std::pair<re2::DFA::State_*const,_int>_>,_std::less<re2::DFA::State_*>,_std::allocator<std::pair<re2::DFA::State_*const,_int>_>_>
    ::~_Rb_tree(&previously_visited_states._M_t);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool DFA::PossibleMatchRange(string* min, string* max, int maxlen) {
  if (!ok())
    return false;

  // NOTE: if future users of PossibleMatchRange want more precision when
  // presented with infinitely repeated elements, consider making this a
  // parameter to PossibleMatchRange.
  static int kMaxEltRepetitions = 0;

  // Keep track of the number of times we've visited states previously. We only
  // revisit a given state if it's part of a repeated group, so if the value
  // portion of the map tuple exceeds kMaxEltRepetitions we bail out and set
  // |*max| to |PrefixSuccessor(*max)|.
  //
  // Also note that previously_visited_states[UnseenStatePtr] will, in the STL
  // tradition, implicitly insert a '0' value at first use. We take advantage
  // of that property below.
  map<State*, int> previously_visited_states;

  // Pick out start state for anchored search at beginning of text.
  RWLocker l(&cache_mutex_);
  SearchParams params(NULL, NULL, &l);
  params.anchored = true;
  if (!AnalyzeSearch(&params))
    return false;
  if (params.start == DeadState) {  // No matching strings
    *min = "";
    *max = "";
    return true;
  }
  if (params.start == FullMatchState)  // Every string matches: no max
    return false;

  // The DFA is essentially a big graph rooted at params.start,
  // and paths in the graph correspond to accepted strings.
  // Each node in the graph has potentially 256+1 arrows
  // coming out, one for each byte plus the magic end of
  // text character kByteEndText.

  // To find the smallest possible prefix of an accepted
  // string, we just walk the graph preferring to follow
  // arrows with the lowest bytes possible.  To find the
  // largest possible prefix, we follow the largest bytes
  // possible.

  // The test for whether there is an arrow from s on byte j is
  //    ns = RunStateOnByteUnlocked(s, j);
  //    if (ns == NULL)
  //      return false;
  //    if (ns != DeadState && ns->ninst > 0)
  // The RunStateOnByteUnlocked call asks the DFA to build out the graph.
  // It returns NULL only if the DFA has run out of memory,
  // in which case we can't be sure of anything.
  // The second check sees whether there was graph built
  // and whether it is interesting graph.  Nodes might have
  // ns->ninst == 0 if they exist only to represent the fact
  // that a match was found on the previous byte.

  // Build minimum prefix.
  State* s = params.start;
  min->clear();
  MutexLock lock(&mutex_);
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and min=" << CEscape(*min);
      break;
    }
    previously_visited_states[s]++;

    // Stop if min is a match.
    State* ns = RunStateOnByte(s, kByteEndText);
    if (ns == NULL)  // DFA out of memory
      return false;
    if (ns != DeadState && (ns == FullMatchState || ns->IsMatch()))
      break;

    // Try to extend the string with low bytes.
    bool extended = false;
    for (int j = 0; j < 256; j++) {
      ns = RunStateOnByte(s, j);
      if (ns == NULL)  // DFA out of memory
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        min->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended)
      break;
  }

  // Build maximum prefix.
  previously_visited_states.clear();
  s = params.start;
  max->clear();
  for (int i = 0; i < maxlen; i++) {
    if (previously_visited_states[s] > kMaxEltRepetitions) {
      VLOG(2) << "Hit kMaxEltRepetitions=" << kMaxEltRepetitions
        << " for state s=" << s << " and max=" << CEscape(*max);
      break;
    }
    previously_visited_states[s] += 1;

    // Try to extend the string with high bytes.
    bool extended = false;
    for (int j = 255; j >= 0; j--) {
      State* ns = RunStateOnByte(s, j);
      if (ns == NULL)
        return false;
      if (ns == FullMatchState ||
          (ns > SpecialStateMax && ns->ninst_ > 0)) {
        extended = true;
        max->append(1, static_cast<char>(j));
        s = ns;
        break;
      }
    }
    if (!extended) {
      // Done, no need for PrefixSuccessor.
      return true;
    }
  }

  // Stopped while still adding to *max - round aaaaaaaaaa... to aaaa...b
  *max = PrefixSuccessor(*max);

  // If there are no bytes left, we have no way to say "there is no maximum
  // string".  We could make the interface more complicated and be able to
  // return "there is no maximum but here is a minimum", but that seems like
  // overkill -- the most common no-max case is all possible strings, so not
  // telling the caller that the empty string is the minimum match isn't a
  // great loss.
  if (max->empty())
    return false;

  return true;
}